

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int gdRotatedImageSize(gdImagePtr src,float angle,gdRectPtr bbox)

{
  int iVar1;
  double local_68;
  double m [6];
  gdRect src_area;
  gdRectPtr bbox_local;
  float angle_local;
  gdImagePtr src_local;
  
  gdAffineRotate(&local_68,(double)angle);
  m[5]._0_4_ = 0;
  m[5]._4_4_ = 0;
  iVar1 = gdTransformAffineBoundingBox((gdRectPtr)(m + 5),&local_68,bbox);
  src_local._4_4_ = (uint)(iVar1 == 1);
  return src_local._4_4_;
}

Assistant:

static int gdRotatedImageSize(gdImagePtr src, const float angle, gdRectPtr bbox)
{
    gdRect src_area;
    double m[6];

    gdAffineRotate(m, angle);
    src_area.x = 0;
    src_area.y = 0;
    src_area.width = gdImageSX(src);
    src_area.height = gdImageSY(src);
    if (gdTransformAffineBoundingBox(&src_area, m, bbox) != GD_TRUE) {
        return GD_FALSE;
    }

    return GD_TRUE;
}